

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O2

ReferenceElement * __thiscall
lsp::ArxmlStorage::addReference(ArxmlStorage *this,ReferenceElement *elem)

{
  _Elt_pointer pRVar1;
  
  std::deque<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>::push_back
            (&this->references_,elem);
  pRVar1 = (this->references_).
           super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pRVar1 == (this->references_).
                super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pRVar1 = (this->references_).
             super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  return pRVar1 + -1;
}

Assistant:

const lsp::ReferenceElement* lsp::ArxmlStorage::addReference(const lsp::ReferenceElement &elem)
{
    references_.push_back(elem);
    return &(references_.back());
}